

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O3

Mat * ncnn::Mat::from_pixels
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                Allocator *allocator)

{
  byte bVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  float *pfVar12;
  float *pfVar13;
  int iVar14;
  byte *pbVar15;
  uint uVar16;
  int iVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Mat local_70;
  
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->refcount + 4) = (undefined1  [16])0x0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      from_rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
    }
    if ((short)type != 4) {
      if ((type & 0xffffU) != 3) {
        return __return_storage_ptr__;
      }
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar6 = (float *)__return_storage_ptr__->data;
      if (pfVar6 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar10 = 1;
      iVar19 = h;
      if (stride - w == 0) {
        iVar10 = h;
        iVar19 = 1;
      }
      if (iVar19 < 1) {
        return __return_storage_ptr__;
      }
      iVar14 = 0;
      pbVar15 = pixels;
      do {
        uVar16 = iVar10 * w + 1;
        if (0 < iVar10 * w) {
          do {
            *pfVar6 = (float)*pbVar15;
            pbVar15 = pbVar15 + 1;
            pfVar6 = pfVar6 + 1;
            uVar16 = uVar16 - 1;
          } while (1 < uVar16);
        }
        pbVar15 = pbVar15 + (stride - w);
        iVar14 = iVar14 + 1;
      } while (iVar14 != iVar19);
      if (type != 4) {
        return __return_storage_ptr__;
      }
    }
    create(__return_storage_ptr__,w,h,4,4,allocator);
    pfVar6 = (float *)__return_storage_ptr__->data;
    if (pfVar6 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar10 = stride + w * -4;
    iVar19 = 1;
    if (iVar10 == 0) {
      iVar19 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    lVar7 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
    pfVar12 = (float *)(lVar7 * 3 + (long)pfVar6);
    pfVar13 = (float *)((long)pfVar6 + lVar7 * 2);
    pfVar8 = (float *)(lVar7 + (long)pfVar6);
    iVar14 = 0;
    do {
      uVar16 = iVar19 * w + 1;
      if (0 < iVar19 * w) {
        do {
          *pfVar6 = (float)*pixels;
          *pfVar8 = (float)pixels[1];
          *pfVar13 = (float)pixels[2];
          *pfVar12 = (float)pixels[3];
          pixels = pixels + 4;
          pfVar6 = pfVar6 + 1;
          pfVar8 = pfVar8 + 1;
          pfVar13 = pfVar13 + 1;
          pfVar12 = pfVar12 + 1;
          uVar16 = uVar16 - 1;
        } while (1 < uVar16);
      }
      pixels = pixels + iVar10;
      iVar14 = iVar14 + 1;
    } while (iVar14 != h);
    return __return_storage_ptr__;
  }
  if (0x30000 < type) {
    if (0x40000 < type) {
      if (type == 0x40001) {
        create(__return_storage_ptr__,w,h,4,4,allocator);
        local_70.data = __return_storage_ptr__->data;
        if (local_70.data == (void *)0x0) {
          return __return_storage_ptr__;
        }
        if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        local_70.w = __return_storage_ptr__->w;
        local_70.h = __return_storage_ptr__->h;
        local_70.elemsize = __return_storage_ptr__->elemsize;
        local_70.elempack = __return_storage_ptr__->elempack;
        local_70.allocator = __return_storage_ptr__->allocator;
        local_70.refcount = (int *)0x0;
        local_70.dims = 3;
        local_70.c = 3;
        local_70.cstep =
             ((long)(local_70.h * local_70.w) * local_70.elemsize + 0xf & 0xfffffffffffffff0) /
             local_70.elemsize;
        from_rgb(pixels,w,h,stride,&local_70,allocator);
        auVar5 = _DAT_00176060;
        auVar4 = _DAT_00176050;
        auVar3 = _DAT_00176040;
        uVar16 = __return_storage_ptr__->h * __return_storage_ptr__->w;
        if (0 < (int)uVar16) {
          pvVar2 = __return_storage_ptr__->data;
          lVar7 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
          lVar11 = (ulong)uVar16 - 1;
          auVar23._8_4_ = (int)lVar11;
          auVar23._0_8_ = lVar11;
          auVar23._12_4_ = (int)((ulong)lVar11 >> 0x20);
          uVar9 = 0;
          auVar23 = auVar23 ^ _DAT_00176060;
          do {
            auVar21._8_4_ = (int)uVar9;
            auVar21._0_8_ = uVar9;
            auVar21._12_4_ = (int)(uVar9 >> 0x20);
            auVar18 = (auVar21 | auVar4) ^ auVar5;
            iVar19 = auVar23._4_4_;
            if ((bool)(~(auVar18._4_4_ == iVar19 && auVar23._0_4_ < auVar18._0_4_ ||
                        iVar19 < auVar18._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar2 + uVar9 * 4 + lVar7 * 3) = 0x437f0000;
            }
            if ((auVar18._12_4_ != auVar23._12_4_ || auVar18._8_4_ <= auVar23._8_4_) &&
                auVar18._12_4_ <= auVar23._12_4_) {
              *(undefined4 *)((long)pvVar2 + uVar9 * 4 + lVar7 * 3 + 4) = 0x437f0000;
            }
            auVar21 = (auVar21 | auVar3) ^ auVar5;
            iVar10 = auVar21._4_4_;
            if (iVar10 <= iVar19 && (iVar10 != iVar19 || auVar21._0_4_ <= auVar23._0_4_)) {
              *(undefined4 *)((long)pvVar2 + uVar9 * 4 + lVar7 * 3 + 8) = 0x437f0000;
              *(undefined4 *)((long)pvVar2 + uVar9 * 4 + lVar7 * 3 + 0xc) = 0x437f0000;
            }
            uVar9 = uVar9 + 4;
          } while ((uVar16 + 3 & 0xfffffffc) != uVar9);
        }
        if (local_70.refcount == (int *)0x0) {
          return __return_storage_ptr__;
        }
        LOCK();
        *local_70.refcount = *local_70.refcount + -1;
        UNLOCK();
        if (*local_70.refcount != 0) {
          return __return_storage_ptr__;
        }
        if (local_70.allocator != (Allocator *)0x0) {
          (*(local_70.allocator)->_vptr_Allocator[3])();
          return __return_storage_ptr__;
        }
      }
      else if (type == 0x40002) {
        create(__return_storage_ptr__,w,h,4,4,allocator);
        local_70.data = __return_storage_ptr__->data;
        if (local_70.data == (void *)0x0) {
          return __return_storage_ptr__;
        }
        if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        local_70.w = __return_storage_ptr__->w;
        local_70.h = __return_storage_ptr__->h;
        local_70.elemsize = __return_storage_ptr__->elemsize;
        local_70.elempack = __return_storage_ptr__->elempack;
        local_70.allocator = __return_storage_ptr__->allocator;
        local_70.refcount = (int *)0x0;
        local_70.dims = 3;
        local_70.c = 3;
        local_70.cstep =
             ((long)(local_70.h * local_70.w) * local_70.elemsize + 0xf & 0xfffffffffffffff0) /
             local_70.elemsize;
        from_rgb2bgr(pixels,w,h,stride,&local_70,allocator);
        auVar5 = _DAT_00176060;
        auVar4 = _DAT_00176050;
        auVar3 = _DAT_00176040;
        uVar16 = __return_storage_ptr__->h * __return_storage_ptr__->w;
        if (0 < (int)uVar16) {
          pvVar2 = __return_storage_ptr__->data;
          lVar7 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
          lVar11 = (ulong)uVar16 - 1;
          auVar18._8_4_ = (int)lVar11;
          auVar18._0_8_ = lVar11;
          auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
          uVar9 = 0;
          auVar18 = auVar18 ^ _DAT_00176060;
          do {
            auVar22._8_4_ = (int)uVar9;
            auVar22._0_8_ = uVar9;
            auVar22._12_4_ = (int)(uVar9 >> 0x20);
            auVar23 = (auVar22 | auVar4) ^ auVar5;
            iVar19 = auVar18._4_4_;
            if ((bool)(~(auVar23._4_4_ == iVar19 && auVar18._0_4_ < auVar23._0_4_ ||
                        iVar19 < auVar23._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar2 + uVar9 * 4 + lVar7 * 3) = 0x437f0000;
            }
            if ((auVar23._12_4_ != auVar18._12_4_ || auVar23._8_4_ <= auVar18._8_4_) &&
                auVar23._12_4_ <= auVar18._12_4_) {
              *(undefined4 *)((long)pvVar2 + uVar9 * 4 + lVar7 * 3 + 4) = 0x437f0000;
            }
            auVar23 = (auVar22 | auVar3) ^ auVar5;
            iVar10 = auVar23._4_4_;
            if (iVar10 <= iVar19 && (iVar10 != iVar19 || auVar23._0_4_ <= auVar18._0_4_)) {
              *(undefined4 *)((long)pvVar2 + uVar9 * 4 + lVar7 * 3 + 8) = 0x437f0000;
              *(undefined4 *)((long)pvVar2 + uVar9 * 4 + lVar7 * 3 + 0xc) = 0x437f0000;
            }
            uVar9 = uVar9 + 4;
          } while ((uVar16 + 3 & 0xfffffffc) != uVar9);
        }
        if (local_70.refcount == (int *)0x0) {
          return __return_storage_ptr__;
        }
        LOCK();
        *local_70.refcount = *local_70.refcount + -1;
        UNLOCK();
        if (*local_70.refcount != 0) {
          return __return_storage_ptr__;
        }
        if (local_70.allocator != (Allocator *)0x0) {
          (*(local_70.allocator)->_vptr_Allocator[3])();
          return __return_storage_ptr__;
        }
      }
      else {
        if (type != 0x40003) {
          return __return_storage_ptr__;
        }
        create(__return_storage_ptr__,w,h,4,4,allocator);
        local_70.data = __return_storage_ptr__->data;
        if (local_70.data == (void *)0x0) {
          return __return_storage_ptr__;
        }
        if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        local_70.w = __return_storage_ptr__->w;
        local_70.h = __return_storage_ptr__->h;
        local_70.elemsize = __return_storage_ptr__->elemsize;
        local_70.elempack = __return_storage_ptr__->elempack;
        local_70.allocator = __return_storage_ptr__->allocator;
        local_70.refcount = (int *)0x0;
        local_70.dims = 3;
        local_70.c = 3;
        local_70.cstep =
             ((long)(local_70.h * local_70.w) * local_70.elemsize + 0xf & 0xfffffffffffffff0) /
             local_70.elemsize;
        from_gray2rgb(pixels,w,h,stride,&local_70,allocator);
        auVar5 = _DAT_00176060;
        auVar4 = _DAT_00176050;
        auVar3 = _DAT_00176040;
        uVar16 = __return_storage_ptr__->h * __return_storage_ptr__->w;
        if (0 < (int)uVar16) {
          pvVar2 = __return_storage_ptr__->data;
          lVar7 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
          lVar11 = (ulong)uVar16 - 1;
          auVar17._8_4_ = (int)lVar11;
          auVar17._0_8_ = lVar11;
          auVar17._12_4_ = (int)((ulong)lVar11 >> 0x20);
          uVar9 = 0;
          auVar17 = auVar17 ^ _DAT_00176060;
          do {
            auVar20._8_4_ = (int)uVar9;
            auVar20._0_8_ = uVar9;
            auVar20._12_4_ = (int)(uVar9 >> 0x20);
            auVar23 = (auVar20 | auVar4) ^ auVar5;
            iVar19 = auVar17._4_4_;
            if ((bool)(~(auVar23._4_4_ == iVar19 && auVar17._0_4_ < auVar23._0_4_ ||
                        iVar19 < auVar23._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar2 + uVar9 * 4 + lVar7 * 3) = 0x437f0000;
            }
            if ((auVar23._12_4_ != auVar17._12_4_ || auVar23._8_4_ <= auVar17._8_4_) &&
                auVar23._12_4_ <= auVar17._12_4_) {
              *(undefined4 *)((long)pvVar2 + uVar9 * 4 + lVar7 * 3 + 4) = 0x437f0000;
            }
            auVar23 = (auVar20 | auVar3) ^ auVar5;
            iVar10 = auVar23._4_4_;
            if (iVar10 <= iVar19 && (iVar10 != iVar19 || auVar23._0_4_ <= auVar17._0_4_)) {
              *(undefined4 *)((long)pvVar2 + uVar9 * 4 + lVar7 * 3 + 8) = 0x437f0000;
              *(undefined4 *)((long)pvVar2 + uVar9 * 4 + lVar7 * 3 + 0xc) = 0x437f0000;
            }
            uVar9 = uVar9 + 4;
          } while ((uVar16 + 3 & 0xfffffffc) != uVar9);
        }
        if (local_70.refcount == (int *)0x0) {
          return __return_storage_ptr__;
        }
        LOCK();
        *local_70.refcount = *local_70.refcount + -1;
        UNLOCK();
        if (*local_70.refcount != 0) {
          return __return_storage_ptr__;
        }
        if (local_70.allocator != (Allocator *)0x0) {
          (*(local_70.allocator)->_vptr_Allocator[3])();
          return __return_storage_ptr__;
        }
      }
      if (local_70.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      free(local_70.data);
      return __return_storage_ptr__;
    }
    if (type == 0x30001) {
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar6 = (float *)__return_storage_ptr__->data;
      if (pfVar6 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar10 = stride + w * -3;
      iVar19 = 1;
      if (iVar10 == 0) {
        iVar19 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      iVar14 = 0;
      do {
        uVar16 = iVar19 * w + 1;
        if (0 < iVar19 * w) {
          do {
            bVar1 = pixels[2];
            *pfVar6 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                              (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d >> 8);
            pixels = pixels + 3;
            pfVar6 = pfVar6 + 1;
            uVar16 = uVar16 - 1;
          } while (1 < uVar16);
        }
        pixels = pixels + iVar10;
        iVar14 = iVar14 + 1;
      } while (iVar14 != h);
      return __return_storage_ptr__;
    }
    if (type == 0x30002) {
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar6 = (float *)__return_storage_ptr__->data;
      if (pfVar6 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar10 = stride + w * -3;
      iVar19 = 1;
      if (iVar10 == 0) {
        iVar19 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      iVar14 = 0;
      do {
        uVar16 = iVar19 * w + 1;
        if (0 < iVar19 * w) {
          do {
            bVar1 = *pixels;
            *pfVar6 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                              (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d >> 8);
            pixels = pixels + 3;
            pfVar6 = pfVar6 + 1;
            uVar16 = uVar16 - 1;
          } while (1 < uVar16);
        }
        pixels = pixels + iVar10;
        iVar14 = iVar14 + 1;
      } while (iVar14 != h);
      return __return_storage_ptr__;
    }
    if (type != 0x30004) {
      return __return_storage_ptr__;
    }
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar6 = (float *)__return_storage_ptr__->data;
    if (pfVar6 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar10 = stride + w * -4;
    iVar19 = 1;
    if (iVar10 == 0) {
      iVar19 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    iVar14 = 0;
    do {
      uVar16 = iVar19 * w + 1;
      if (0 < iVar19 * w) {
        do {
          bVar1 = pixels[2];
          *pfVar6 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                            (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d >> 8);
          pixels = pixels + 4;
          pfVar6 = pfVar6 + 1;
          uVar16 = uVar16 - 1;
        } while (1 < uVar16);
      }
      pixels = pixels + iVar10;
      iVar14 = iVar14 + 1;
    } while (iVar14 != h);
    return __return_storage_ptr__;
  }
  if (type < 0x20001) {
    if (type == 0x10002) {
LAB_0011a873:
      from_rgb2bgr(pixels,w,h,stride,__return_storage_ptr__,allocator);
      return __return_storage_ptr__;
    }
    if (type != 0x10003) {
      if (type != 0x10004) {
        return __return_storage_ptr__;
      }
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar6 = (float *)__return_storage_ptr__->data;
      if (pfVar6 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar10 = stride + w * -4;
      iVar19 = 1;
      if (iVar10 == 0) {
        iVar19 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar7 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pfVar13 = (float *)((long)pfVar6 + lVar7 * 2);
      pfVar8 = (float *)(lVar7 + (long)pfVar6);
      iVar14 = 0;
      do {
        uVar16 = iVar19 * w + 1;
        if (0 < iVar19 * w) {
          do {
            *pfVar6 = (float)*pixels;
            *pfVar8 = (float)pixels[1];
            *pfVar13 = (float)pixels[2];
            pixels = pixels + 4;
            pfVar6 = pfVar6 + 1;
            pfVar8 = pfVar8 + 1;
            pfVar13 = pfVar13 + 1;
            uVar16 = uVar16 - 1;
          } while (1 < uVar16);
        }
        pixels = pixels + iVar10;
        iVar14 = iVar14 + 1;
      } while (iVar14 != h);
      return __return_storage_ptr__;
    }
  }
  else {
    if (type == 0x20001) goto LAB_0011a873;
    if (type != 0x20003) {
      if (type != 0x20004) {
        return __return_storage_ptr__;
      }
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar6 = (float *)__return_storage_ptr__->data;
      if (pfVar6 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar10 = stride + w * -4;
      iVar19 = 1;
      if (iVar10 == 0) {
        iVar19 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar7 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pfVar13 = (float *)((long)pfVar6 + lVar7 * 2);
      pfVar8 = (float *)(lVar7 + (long)pfVar6);
      iVar14 = 0;
      do {
        uVar16 = iVar19 * w + 1;
        if (0 < iVar19 * w) {
          do {
            *pfVar6 = (float)pixels[2];
            *pfVar8 = (float)pixels[1];
            *pfVar13 = (float)*pixels;
            pixels = pixels + 4;
            pfVar6 = pfVar6 + 1;
            pfVar8 = pfVar8 + 1;
            pfVar13 = pfVar13 + 1;
            uVar16 = uVar16 - 1;
          } while (1 < uVar16);
        }
        pixels = pixels + iVar10;
        iVar14 = iVar14 + 1;
      } while (iVar14 != h);
      return __return_storage_ptr__;
    }
  }
  from_gray2rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, int stride, Allocator* allocator)
{
    Mat m;

    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            from_rgb2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2GRAY:
            from_rgb2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2RGBA:
            from_rgb2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2GRAY:
            from_bgr2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2RGBA:
            from_bgr2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGB:
        case PIXEL_GRAY2BGR:
            from_gray2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGBA:
            from_gray2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2RGB:
            from_rgba2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGR:
            from_rgba2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2GRAY:
            from_rgba2gray(pixels, w, h, stride, m, allocator);
            break;
        default:
            // unimplemented convert type
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            from_rgb(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_GRAY)
            from_gray(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_RGBA)
            from_rgba(pixels, w, h, stride, m, allocator);
    }

    return m;
}